

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflectance.cpp
# Opt level: O0

Spectrum * __thiscall
phyr::BSDF::rho(BSDF *this,int nSamples,Point2f *samples1,Point2f *samples2,BxDFType flags)

{
  long *plVar1;
  bool bVar2;
  undefined8 in_RCX;
  undefined4 in_EDX;
  long in_RSI;
  CoefficientSpectrum<60> *in_RDI;
  undefined8 in_R8;
  BxDFType in_R9D;
  int i;
  double in_stack_fffffffffffffdd8;
  CoefficientSpectrum<60> *this_00;
  CoefficientSpectrum<60> local_208;
  int local_28;
  BxDFType local_24;
  undefined8 local_20;
  undefined8 local_18;
  undefined4 local_c;
  
  this_00 = in_RDI;
  local_24 = in_R9D;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_c = in_EDX;
  SampledSpectrum::SampledSpectrum((SampledSpectrum *)in_RDI,in_stack_fffffffffffffdd8);
  for (local_28 = 0; local_28 < *(int *)(in_RSI + 0x68); local_28 = local_28 + 1) {
    bVar2 = BxDF::matchesFlags(*(BxDF **)(in_RSI + 0x70 + (long)local_28 * 8),local_24);
    if (bVar2) {
      plVar1 = *(long **)(in_RSI + 0x70 + (long)local_28 * 8);
      (**(code **)(*plVar1 + 0x28))(&local_208,plVar1,local_c,local_18,local_20);
      CoefficientSpectrum<60>::operator+=(this_00,&local_208);
    }
  }
  return (Spectrum *)in_RDI;
}

Assistant:

Spectrum BSDF::rho(int nSamples, const Point2f* samples1,
                   const Point2f* samples2, BxDFType flags) const {
    Spectrum ret(0.f);
    for (int i = 0; i < nBxDFs; ++i)
        if (bxdfs[i]->matchesFlags(flags))
            ret += bxdfs[i]->rho(nSamples, samples1, samples2);
    return ret;
}